

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.h
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeBodyBushingSpherical::~ChLoadXYZROTnodeBodyBushingSpherical
          (ChLoadXYZROTnodeBodyBushingSpherical *this)

{
  ChLoadCustomMultiple::~ChLoadCustomMultiple((ChLoadCustomMultiple *)this);
  ::operator_delete(this,0x3c8);
  return;
}

Assistant:

class ChApi ChLoadXYZROTnodeBodyBushingSpherical : public ChLoadXYZROTnodeBody {
  public:
    ChLoadXYZROTnodeBodyBushingSpherical(
        std::shared_ptr<ChNodeFEAxyzrot> mnodeA,  ///< node A
        std::shared_ptr<ChBody> mbodyB,           ///< body B
        const ChFrame<>& abs_application,         ///< bushing location, in abs. coordinates.
        const ChVector<>& mstiffness,             ///< stiffness, along x y z axes of the abs_application
        const ChVector<>& mdamping                ///< damping, along x y z axes of the abs_application
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadXYZROTnodeBodyBushingSpherical* Clone() const override {
        return new ChLoadXYZROTnodeBodyBushingSpherical(*this);
    }

    /// Set stiffness, along the x y z axes of loc_application_B, es [N/m]
    void SetStiffness(const ChVector<> mstiffness) { stiffness = mstiffness; }
    ChVector<> GetStiffness() const { return stiffness; }

    /// Set damping, along the x y z axes of loc_application_B, es [Ns/m]
    void SetDamping(const ChVector<> mdamping) { damping = mdamping; }
    ChVector<> GetDamping() const { return damping; }

  protected:
    ChVector<> stiffness;
    ChVector<> damping;

    virtual bool IsStiff() override { return true; }

    /// Compute the wrench (force & torque) between the two nodes, expressed in local frame of loc_application_B,
    /// given rel_AB, i.e. the position and speed of loc_application_A respect to loc_application_B, expressed in frame
    /// of loc_application_B. Force is assumed applied to loc_application_B, and its opposite reaction to A.
    virtual void ComputeForceTorque(const ChFrameMoving<>& rel_AB,
                                    ChVector<>& loc_force,
                                    ChVector<>& loc_torque) override;
}